

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.cpp
# Opt level: O2

void __thiscall Electron::Tape::Tape(Tape *this)

{
  Storage::Tape::TapePlayer::TapePlayer(&this->super_TapePlayer,2000000);
  (this->super_TapePlayer).super_TimedEventLoop._vptr_TimedEventLoop =
       (_func_int **)&PTR_process_next_event_00584908;
  (this->super_TapePlayer).super_Source._vptr_Source = (_func_int **)&DAT_00584950;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_00584968;
  this->data_register_ = 0;
  this->interrupt_status_ = '\0';
  this->last_posted_interrupt_status_ = '\0';
  this->delegate_ = (Delegate *)0x0;
  this->input_ = 0;
  (this->output_).cycles_into_pulse = 0;
  *(undefined8 *)((long)&(this->output_).cycles_into_pulse + 3) = 0;
  Storage::Tape::Acorn::Shifter::Shifter(&this->shifter_);
  (this->shifter_).delegate_ = &this->super_Delegate;
  return;
}

Assistant:

Tape::Tape() : TapePlayer(2000000) {
	shifter_.set_delegate(this);
}